

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_subgroup_op(CompilerHLSL *this,Instruction *i)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ushort uVar3;
  uint32_t result_id;
  BaseType BVar4;
  uint uVar5;
  bool bVar6;
  uint32_t uVar7;
  uint uVar8;
  size_type sVar9;
  CompilerError *this_00;
  uint32_t uVar10;
  uint32_t op1;
  char *pcVar11;
  string *psVar12;
  BaseType input_type;
  char (*ts_3) [2];
  __hashtable *__h;
  uint32_t *ops;
  __node_gen_type __node_gen;
  string right;
  string left;
  anon_class_16_2_633b9ddf make_inclusive_Product;
  anon_class_16_2_633b9ddf make_inclusive_Sum;
  char (*in_stack_ffffffffffffff18) [26];
  char (*in_stack_ffffffffffffff20) [2];
  uint32_t *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  anon_class_16_2_633b9ddf local_50;
  anon_class_16_2_633b9ddf local_40;
  
  if ((this->hlsl_options).shader_model < 0x3c) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Wave ops requires SM 6.0 or higher.");
    goto LAB_00249903;
  }
  local_d8 = Compiler::stream((Compiler *)this,i);
  uVar3 = i->op;
  uVar10 = *local_d8;
  result_id = local_d8[1];
  uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,local_d8[2]);
  if (uVar7 != 3) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Only subgroup scope is supported.");
    goto LAB_00249903;
  }
  local_50.ops = &local_d8;
  local_50.this = this;
  local_40.this = this;
  local_40.ops = local_50.ops;
  uVar7 = CompilerGLSL::get_integer_width_for_instruction(&this->super_CompilerGLSL,i);
  uVar5 = uVar7 - 8 >> 3;
  uVar8 = uVar7 << 0x1d | uVar5;
  if ((7 < uVar8) || ((0x8bU >> (uVar5 & 0x1f) & 1) == 0)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid bit width.");
    goto LAB_00249903;
  }
  if ((0x8bU >> (uVar5 & 0x1f) & 1) == 0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid bit width.");
    goto LAB_00249903;
  }
  if (0x21 < uVar3 - 0x14d) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid opcode for subgroup.");
    goto LAB_00249903;
  }
  input_type = *(BaseType *)(&DAT_003f8b7c + (ulong)uVar8 * 4);
  BVar4 = *(BaseType *)(&DAT_003f8b9c + (ulong)uVar8 * 4);
  ts_3 = (char (*) [2])(ulong)BVar4;
  switch((uint)uVar3) {
  case 0x14d:
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"WaveIsFirstLane()","");
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar10,result_id,&local_90,true,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_00249871;
    goto LAB_002496ee;
  case 0x14e:
    uVar7 = local_d8[3];
    pcVar11 = "WaveActiveAllTrue";
    break;
  case 0x14f:
    uVar7 = local_d8[3];
    pcVar11 = "WaveActiveAnyTrue";
    break;
  case 0x150:
    uVar7 = local_d8[3];
    pcVar11 = "WaveActiveAllEqual";
    break;
  default:
    uVar7 = local_d8[3];
    op1 = local_d8[4];
    pcVar11 = "WaveReadLaneAt";
    goto LAB_00248b8c;
  case 0x152:
    uVar7 = local_d8[3];
    pcVar11 = "WaveReadLaneFirst";
    break;
  case 0x153:
    uVar7 = local_d8[3];
    pcVar11 = "WaveActiveBallot";
    break;
  case 0x154:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot trivially implement InverseBallot in HLSL.");
    goto LAB_00249903;
  case 0x155:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot trivially implement BallotBitExtract in HLSL.");
    goto LAB_00249903;
  case 0x156:
    uVar7 = local_d8[3];
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_d8[4]);
    if (uVar7 == 2) {
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_b0,&this->super_CompilerGLSL,local_d8[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                (&local_90,(spirv_cross *)0x3f6c76,(char (*) [11])&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".x & gl_SubgroupLtMask.x) + countbits(",(char (*) [39])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".y & gl_SubgroupLtMask.y)",in_stack_ffffffffffffff18);
      paVar2 = &local_d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,local_d8[4],true);
      psVar12 = &local_70;
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                (&local_b0,(spirv_cross *)0x3f6c76,(char (*) [11])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".z & gl_SubgroupLtMask.z) + countbits(",(char (*) [39])psVar12,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".w & gl_SubgroupLtMask.w)",in_stack_ffffffffffffff18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      join<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&>
                (&local_d0,(spirv_cross *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fe36f,
                 (char (*) [4])&local_b0,psVar12);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar10,result_id,&local_d0,bVar6,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      local_d0._M_dataplus._M_p._0_4_ = 0x1144;
      puVar1 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher;
      sVar9 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&puVar1->_M_h,(key_type_conflict *)&local_d0);
      if (sVar9 == 0) {
        local_70._M_dataplus._M_p._0_4_ = 0x1144;
        local_d0._M_dataplus._M_p = (pointer)puVar1;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)puVar1);
        Compiler::force_recompile_guarantee_forward_progress((Compiler *)this);
      }
    }
    else if (uVar7 == 1) {
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_b0,&this->super_CompilerGLSL,local_d8[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                (&local_90,(spirv_cross *)0x3f6c76,(char (*) [11])&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".x & gl_SubgroupLeMask.x) + countbits(",(char (*) [39])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".y & gl_SubgroupLeMask.y)",in_stack_ffffffffffffff18);
      paVar2 = &local_d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,local_d8[4],true);
      psVar12 = &local_70;
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                (&local_b0,(spirv_cross *)0x3f6c76,(char (*) [11])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".z & gl_SubgroupLeMask.z) + countbits(",(char (*) [39])psVar12,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".w & gl_SubgroupLeMask.w)",in_stack_ffffffffffffff18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      join<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&>
                (&local_d0,(spirv_cross *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fe36f,
                 (char (*) [4])&local_b0,psVar12);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar10,result_id,&local_d0,bVar6,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      local_d0._M_dataplus._M_p._0_4_ = 0x1143;
      puVar1 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher;
      sVar9 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&puVar1->_M_h,(key_type_conflict *)&local_d0);
      if (sVar9 == 0) {
        local_70._M_dataplus._M_p._0_4_ = 0x1143;
        local_d0._M_dataplus._M_p = (pointer)puVar1;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)puVar1);
        Compiler::force_recompile_guarantee_forward_progress((Compiler *)this);
      }
    }
    else {
      if (uVar7 != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid BitCount operation.");
        goto LAB_00249903;
      }
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_b0,&this->super_CompilerGLSL,local_d8[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[17],std::__cxx11::string,char_const(&)[4]>
                (&local_90,(spirv_cross *)0x3f6c76,(char (*) [11])&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f6c70,
                 (char (*) [17])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f6c97,
                 (char (*) [4])in_stack_ffffffffffffff18);
      paVar2 = &local_d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,local_d8[4],true);
      psVar12 = &local_70;
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[17],std::__cxx11::string,char_const(&)[4]>
                (&local_b0,(spirv_cross *)0x3f6c76,(char (*) [11])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f6cb1,
                 (char (*) [17])psVar12,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f6cd8,
                 (char (*) [4])in_stack_ffffffffffffff18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      join<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&>
                (&local_d0,(spirv_cross *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fe36f,
                 (char (*) [4])&local_b0,psVar12);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar10,result_id,&local_d0,bVar6,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      Compiler::inherit_expression_dependencies((Compiler *)this,result_id,local_d8[4]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_00249871;
LAB_002496ee:
    operator_delete(local_90._M_dataplus._M_p);
    goto LAB_00249871;
  case 0x157:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot trivially implement BallotFindLSB in HLSL.");
    goto LAB_00249903;
  case 0x158:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot trivially implement BallotFindMSB in HLSL.");
    goto LAB_00249903;
  case 0x15a:
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_d8[3]);
    uVar10 = *local_d8;
    uVar7 = local_d8[1];
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_b0,&this->super_CompilerGLSL,local_d8[3],true);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_
              (&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
    join<char_const(&)[16],std::__cxx11::string,char_const(&)[3],char_const(&)[22],std::__cxx11::string,char_const(&)[2]>
              (&local_90,(spirv_cross *)"WaveReadLaneAt(",(char (*) [16])&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x407185,
               (char (*) [3])"WaveGetLaneIndex() ^ ",(char (*) [22])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,
               in_stack_ffffffffffffff20);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar10,uVar7,&local_90,bVar6,false);
    goto LAB_0024920c;
  case 0x15b:
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_d8[3]);
    uVar10 = *local_d8;
    uVar7 = local_d8[1];
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_b0,&this->super_CompilerGLSL,local_d8[3],true);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_
              (&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
    join<char_const(&)[16],std::__cxx11::string,char_const(&)[3],char_const(&)[22],std::__cxx11::string,char_const(&)[2]>
              (&local_90,(spirv_cross *)"WaveReadLaneAt(",(char (*) [16])&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x407185,
               (char (*) [3])"WaveGetLaneIndex() - ",(char (*) [22])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,
               in_stack_ffffffffffffff20);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar10,uVar7,&local_90,bVar6,false);
    goto LAB_0024920c;
  case 0x15c:
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_d8[3]);
    uVar10 = *local_d8;
    uVar7 = local_d8[1];
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_b0,&this->super_CompilerGLSL,local_d8[3],true);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_
              (&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
    join<char_const(&)[16],std::__cxx11::string,char_const(&)[3],char_const(&)[22],std::__cxx11::string,char_const(&)[2]>
              (&local_90,(spirv_cross *)"WaveReadLaneAt(",(char (*) [16])&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x407185,
               (char (*) [3])"WaveGetLaneIndex() + ",(char (*) [22])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,
               in_stack_ffffffffffffff20);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar10,uVar7,&local_90,bVar6,false);
LAB_0024920c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    uVar10 = local_d8[3];
    uVar7 = local_d8[1];
LAB_0024986c:
    Compiler::inherit_expression_dependencies((Compiler *)this,uVar7,uVar10);
    goto LAB_00249871;
  case 0x15d:
    switch(local_d8[3]) {
    case 0:
switchD_00248bff_caseD_0:
      uVar7 = local_d8[4];
      pcVar11 = "WaveActiveSum";
      break;
    case 1:
      bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_d8[4]);
      CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
      join<char_const(&)[14],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_b0,(spirv_cross *)"WavePrefixSum",(char (*) [14])0x40a721,
                 (char (*) [2])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,ts_3)
      ;
      emit_subgroup_op::anon_class_16_2_633b9ddf::operator()(&local_90,&local_40,&local_b0);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar10,result_id,&local_90,bVar6,false);
LAB_00249826:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      uVar10 = local_d8[4];
      uVar7 = result_id;
      goto LAB_0024986c;
    case 2:
switchD_00248bff_caseD_2:
      uVar7 = local_d8[4];
      pcVar11 = "WavePrefixSum";
      break;
    case 3:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      goto LAB_00249903;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00249903;
    }
    break;
  case 0x15e:
    switch(local_d8[3]) {
    case 0:
      goto switchD_00248bff_caseD_0;
    case 1:
      bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_d8[4]);
      CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
      join<char_const(&)[14],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_b0,(spirv_cross *)"WavePrefixSum",(char (*) [14])0x40a721,
                 (char (*) [2])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,ts_3)
      ;
      emit_subgroup_op::anon_class_16_2_633b9ddf::operator()(&local_90,&local_40,&local_b0);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar10,result_id,&local_90,bVar6,false);
      goto LAB_00249826;
    case 2:
      goto switchD_00248bff_caseD_2;
    case 3:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_00249903;
  case 0x15f:
    switch(local_d8[3]) {
    case 0:
switchD_00249089_caseD_0:
      uVar7 = local_d8[4];
      pcVar11 = "WaveActiveProduct";
      break;
    case 1:
      bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_d8[4]);
      CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
      join<char_const(&)[18],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_b0,(spirv_cross *)"WavePrefixProduct",(char (*) [18])0x40a721,
                 (char (*) [2])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,ts_3)
      ;
      emit_subgroup_op::anon_class_16_2_633b9ddf::operator()(&local_90,&local_50,&local_b0);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar10,result_id,&local_90,bVar6,false);
      goto LAB_00249826;
    case 2:
switchD_00249089_caseD_2:
      uVar7 = local_d8[4];
      pcVar11 = "WavePrefixProduct";
      break;
    case 3:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      goto LAB_00249903;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00249903;
    }
    break;
  case 0x160:
    switch(local_d8[3]) {
    case 0:
      goto switchD_00249089_caseD_0;
    case 1:
      bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_d8[4]);
      CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,local_d8[4],true);
      join<char_const(&)[18],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_b0,(spirv_cross *)"WavePrefixProduct",(char (*) [18])0x40a721,
                 (char (*) [2])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,ts_3)
      ;
      emit_subgroup_op::anon_class_16_2_633b9ddf::operator()(&local_90,&local_50,&local_b0);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar10,result_id,&local_90,bVar6,false);
      goto LAB_00249826;
    case 2:
      goto switchD_00249089_caseD_2;
    case 3:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
LAB_00249903:
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0x161:
    if (local_d8[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveMin";
    goto LAB_00249348;
  case 0x162:
    if (local_d8[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveMin";
    input_type = BVar4;
    goto LAB_00249348;
  case 0x163:
    if (local_d8[3] != 0) {
      if (local_d8[3] == 3) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      }
      else {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
      }
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveMin";
    break;
  case 0x164:
    if (local_d8[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveMax";
    goto LAB_00249348;
  case 0x165:
    if (local_d8[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveMax";
    input_type = BVar4;
    goto LAB_00249348;
  case 0x166:
    if (local_d8[3] != 0) {
      if (local_d8[3] == 3) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      }
      else {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
      }
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveMax";
    break;
  case 0x167:
    if (local_d8[3] != 0) {
      if (local_d8[3] == 3) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      }
      else {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
      }
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveBitAnd";
    break;
  case 0x168:
    if (local_d8[3] != 0) {
      if (local_d8[3] == 3) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      }
      else {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
      }
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveBitOr";
    break;
  case 0x169:
    if (local_d8[3] != 0) {
      if (local_d8[3] == 3) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      }
      else {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
      }
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveBitXor";
    break;
  case 0x16a:
    if (local_d8[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveBitAnd";
    input_type = BVar4;
    goto LAB_00249348;
  case 0x16b:
    if (local_d8[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveBitOr";
    input_type = BVar4;
    goto LAB_00249348;
  case 0x16c:
    if (local_d8[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00249903;
    }
    uVar7 = local_d8[4];
    pcVar11 = "WaveActiveBitXor";
    input_type = BVar4;
LAB_00249348:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,uVar10,result_id,uVar7,pcVar11,input_type,input_type);
    goto LAB_00249871;
  case 0x16d:
    uVar7 = local_d8[3];
    op1 = local_d8[4];
    pcVar11 = "QuadReadLaneAt";
LAB_00248b8c:
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,uVar10,result_id,uVar7,op1,pcVar11);
    goto LAB_00249871;
  case 0x16e:
    uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,local_d8[4]);
    if (uVar7 == 2) {
      uVar7 = local_d8[3];
      pcVar11 = "QuadReadAcrossDiagonal";
    }
    else if (uVar7 == 1) {
      uVar7 = local_d8[3];
      pcVar11 = "QuadReadAcrossY";
    }
    else {
      if (uVar7 != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid quad swap direction.");
        goto LAB_00249903;
      }
      uVar7 = local_d8[3];
      pcVar11 = "QuadReadAcrossX";
    }
  }
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,uVar10,result_id,uVar7,pcVar11);
LAB_00249871:
  CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,result_id);
  return;
}

Assistant:

void CompilerHLSL::emit_subgroup_op(const Instruction &i)
{
	if (hlsl_options.shader_model < 60)
		SPIRV_CROSS_THROW("Wave ops requires SM 6.0 or higher.");

	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];

	auto scope = static_cast<Scope>(evaluate_constant_u32(ops[2]));
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	const auto make_inclusive_Sum = [&](const string &expr) -> string {
		return join(expr, " + ", to_expression(ops[4]));
	};

	const auto make_inclusive_Product = [&](const string &expr) -> string {
		return join(expr, " * ", to_expression(ops[4]));
	};

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

#define make_inclusive_BitAnd(expr) ""
#define make_inclusive_BitOr(expr) ""
#define make_inclusive_BitXor(expr) ""
#define make_inclusive_Min(expr) ""
#define make_inclusive_Max(expr) ""

	switch (op)
	{
	case OpGroupNonUniformElect:
		emit_op(result_type, id, "WaveIsFirstLane()", true);
		break;

	case OpGroupNonUniformBroadcast:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "WaveReadLaneAt");
		break;

	case OpGroupNonUniformBroadcastFirst:
		emit_unary_func_op(result_type, id, ops[3], "WaveReadLaneFirst");
		break;

	case OpGroupNonUniformBallot:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		SPIRV_CROSS_THROW("Cannot trivially implement InverseBallot in HLSL.");

	case OpGroupNonUniformBallotBitExtract:
		SPIRV_CROSS_THROW("Cannot trivially implement BallotBitExtract in HLSL.");

	case OpGroupNonUniformBallotFindLSB:
		SPIRV_CROSS_THROW("Cannot trivially implement BallotFindLSB in HLSL.");

	case OpGroupNonUniformBallotFindMSB:
		SPIRV_CROSS_THROW("Cannot trivially implement BallotFindMSB in HLSL.");

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		bool forward = should_forward(ops[4]);
		if (operation == GroupOperationReduce)
		{
			auto left = join("countbits(", to_enclosed_expression(ops[4]), ".x) + countbits(",
			                 to_enclosed_expression(ops[4]), ".y)");
			auto right = join("countbits(", to_enclosed_expression(ops[4]), ".z) + countbits(",
			                  to_enclosed_expression(ops[4]), ".w)");
			emit_op(result_type, id, join(left, " + ", right), forward);
			inherit_expression_dependencies(id, ops[4]);
		}
		else if (operation == GroupOperationInclusiveScan)
		{
			auto left = join("countbits(", to_enclosed_expression(ops[4]), ".x & gl_SubgroupLeMask.x) + countbits(",
			                 to_enclosed_expression(ops[4]), ".y & gl_SubgroupLeMask.y)");
			auto right = join("countbits(", to_enclosed_expression(ops[4]), ".z & gl_SubgroupLeMask.z) + countbits(",
			                  to_enclosed_expression(ops[4]), ".w & gl_SubgroupLeMask.w)");
			emit_op(result_type, id, join(left, " + ", right), forward);
			if (!active_input_builtins.get(BuiltInSubgroupLeMask))
			{
				active_input_builtins.set(BuiltInSubgroupLeMask);
				force_recompile_guarantee_forward_progress();
			}
		}
		else if (operation == GroupOperationExclusiveScan)
		{
			auto left = join("countbits(", to_enclosed_expression(ops[4]), ".x & gl_SubgroupLtMask.x) + countbits(",
			                 to_enclosed_expression(ops[4]), ".y & gl_SubgroupLtMask.y)");
			auto right = join("countbits(", to_enclosed_expression(ops[4]), ".z & gl_SubgroupLtMask.z) + countbits(",
			                  to_enclosed_expression(ops[4]), ".w & gl_SubgroupLtMask.w)");
			emit_op(result_type, id, join(left, " + ", right), forward);
			if (!active_input_builtins.get(BuiltInSubgroupLtMask))
			{
				active_input_builtins.set(BuiltInSubgroupLtMask);
				force_recompile_guarantee_forward_progress();
			}
		}
		else
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "WaveReadLaneAt");
		break;
	case OpGroupNonUniformShuffleXor:
	{
		bool forward = should_forward(ops[3]);
		emit_op(ops[0], ops[1],
		        join("WaveReadLaneAt(", to_unpacked_expression(ops[3]), ", ",
		             "WaveGetLaneIndex() ^ ", to_enclosed_expression(ops[4]), ")"), forward);
		inherit_expression_dependencies(ops[1], ops[3]);
		break;
	}
	case OpGroupNonUniformShuffleUp:
	{
		bool forward = should_forward(ops[3]);
		emit_op(ops[0], ops[1],
		        join("WaveReadLaneAt(", to_unpacked_expression(ops[3]), ", ",
		             "WaveGetLaneIndex() - ", to_enclosed_expression(ops[4]), ")"), forward);
		inherit_expression_dependencies(ops[1], ops[3]);
		break;
	}
	case OpGroupNonUniformShuffleDown:
	{
		bool forward = should_forward(ops[3]);
		emit_op(ops[0], ops[1],
		        join("WaveReadLaneAt(", to_unpacked_expression(ops[3]), ", ",
		             "WaveGetLaneIndex() + ", to_enclosed_expression(ops[4]), ")"), forward);
		inherit_expression_dependencies(ops[1], ops[3]);
		break;
	}

	case OpGroupNonUniformAll:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveAllTrue");
		break;

	case OpGroupNonUniformAny:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveAnyTrue");
		break;

	case OpGroupNonUniformAllEqual:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveAllEqual");
		break;

	// clang-format off
#define HLSL_GROUP_OP(op, hlsl_op, supports_scan) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[4], "WaveActive" #hlsl_op); \
		else if (operation == GroupOperationInclusiveScan && supports_scan) \
        { \
			bool forward = should_forward(ops[4]); \
			emit_op(result_type, id, make_inclusive_##hlsl_op (join("WavePrefix" #hlsl_op, "(", to_expression(ops[4]), ")")), forward); \
			inherit_expression_dependencies(id, ops[4]); \
        } \
		else if (operation == GroupOperationExclusiveScan && supports_scan) \
			emit_unary_func_op(result_type, id, ops[4], "WavePrefix" #hlsl_op); \
		else if (operation == GroupOperationClusteredReduce) \
			SPIRV_CROSS_THROW("Cannot trivially implement ClusteredReduce in HLSL."); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

#define HLSL_GROUP_OP_CAST(op, hlsl_op, type) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op_cast(result_type, id, ops[4], "WaveActive" #hlsl_op, type, type); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

	HLSL_GROUP_OP(FAdd, Sum, true)
	HLSL_GROUP_OP(FMul, Product, true)
	HLSL_GROUP_OP(FMin, Min, false)
	HLSL_GROUP_OP(FMax, Max, false)
	HLSL_GROUP_OP(IAdd, Sum, true)
	HLSL_GROUP_OP(IMul, Product, true)
	HLSL_GROUP_OP_CAST(SMin, Min, int_type)
	HLSL_GROUP_OP_CAST(SMax, Max, int_type)
	HLSL_GROUP_OP_CAST(UMin, Min, uint_type)
	HLSL_GROUP_OP_CAST(UMax, Max, uint_type)
	HLSL_GROUP_OP(BitwiseAnd, BitAnd, false)
	HLSL_GROUP_OP(BitwiseOr, BitOr, false)
	HLSL_GROUP_OP(BitwiseXor, BitXor, false)
	HLSL_GROUP_OP_CAST(LogicalAnd, BitAnd, uint_type)
	HLSL_GROUP_OP_CAST(LogicalOr, BitOr, uint_type)
	HLSL_GROUP_OP_CAST(LogicalXor, BitXor, uint_type)

#undef HLSL_GROUP_OP
#undef HLSL_GROUP_OP_CAST
		// clang-format on

	case OpGroupNonUniformQuadSwap:
	{
		uint32_t direction = evaluate_constant_u32(ops[4]);
		if (direction == 0)
			emit_unary_func_op(result_type, id, ops[3], "QuadReadAcrossX");
		else if (direction == 1)
			emit_unary_func_op(result_type, id, ops[3], "QuadReadAcrossY");
		else if (direction == 2)
			emit_unary_func_op(result_type, id, ops[3], "QuadReadAcrossDiagonal");
		else
			SPIRV_CROSS_THROW("Invalid quad swap direction.");
		break;
	}

	case OpGroupNonUniformQuadBroadcast:
	{
		emit_binary_func_op(result_type, id, ops[3], ops[4], "QuadReadLaneAt");
		break;
	}

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	register_control_dependent_expression(id);
}